

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v11::vprint_buffered(FILE *f,string_view fmt,format_args args)

{
  memory_buffer buffer;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> local_220;
  
  local_220.super_buffer<char>.ptr_ = local_220.store_;
  local_220.super_buffer<char>.size_ = 0;
  local_220.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_220.super_buffer<char>.capacity_ = 500;
  detail::vformat_to(&local_220.super_buffer<char>,fmt,args,(locale_ref)0x0);
  detail::fwrite_all(local_220.super_buffer<char>.ptr_,local_220.super_buffer<char>.size_,f);
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate(&local_220);
  return;
}

Assistant:

FMT_FUNC void vprint_buffered(std::FILE* f, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  detail::print(f, {buffer.data(), buffer.size()});
}